

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

int __thiscall slang::parsing::NumberParser::append(NumberParser *this,Token token,bool isFirst)

{
  bool bVar1;
  uint8_t uVar2;
  SmallVectorBase<char> *pSVar3;
  size_type sVar4;
  const_reference pvVar5;
  SourceLocation location_00;
  byte in_CL;
  TokenKind in_SI;
  long in_RDI;
  char c_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  string_view *__range3_3;
  char c_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  string_view *__range3_2;
  char c_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  string_view *__range3_1;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  int index;
  SourceLocation location;
  string_view chars;
  NumberParser *in_stack_fffffffffffffeb0;
  int maxValue;
  SourceLocation in_stack_fffffffffffffeb8;
  DiagCode DVar6;
  logic_t digit;
  logic_t local_123;
  uint8_t local_122;
  char local_121;
  char *local_120;
  char *local_118;
  basic_string_view<char,_std::char_traits<char>_> *local_110;
  SourceLocation local_108;
  undefined4 local_fc;
  SourceLocation local_f8;
  undefined4 local_ee;
  char local_e9;
  char *local_e8;
  char *local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d8;
  uint8_t local_b9;
  SourceLocation local_b8;
  undefined4 local_b0;
  logic_t local_ab;
  uint8_t local_aa;
  char local_a9;
  char *local_a8;
  char *local_a0;
  basic_string_view<char,_std::char_traits<char>_> *local_98;
  SourceLocation local_90;
  undefined4 local_88;
  logic_t local_83;
  uint8_t local_82;
  char local_81;
  char *local_80;
  char *local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  int local_64;
  SourceLocation local_60;
  undefined4 local_54;
  SourceLocation local_50;
  string_view local_48;
  string_view local_38;
  byte local_21;
  Token local_18;
  
  local_21 = in_CL & 1;
  pSVar3 = (SmallVectorBase<char> *)(in_RDI + 0x80);
  local_18.kind = in_SI;
  local_38 = Token::rawText((Token *)pSVar3);
  SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
            (pSVar3,(basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8);
  if ((*(byte *)(in_RDI + 0x1a) & 1) == 0) {
    return -1;
  }
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  local_48 = Token::rawText((Token *)pSVar3);
  local_50 = Token::location(&local_18);
  if ((((local_21 & 1) != 0) &&
      (sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48), sVar4 != 0)
      ) && (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_48,0),
           *pvVar5 == '_')) {
    local_54 = 3;
    local_60 = local_50;
    addDiag(in_stack_fffffffffffffeb0,SUB84((ulong)pSVar3 >> 0x20,0),in_stack_fffffffffffffeb8);
    return -1;
  }
  local_64 = 0;
  location_00._1_7_ = 0;
  location_00._0_1_ = *(byte *)(in_RDI + 4);
  switch(location_00) {
  case (SourceLocation)0x0:
    local_70 = &local_48;
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_70);
    local_80 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_70);
    for (; local_78 != local_80; local_78 = local_78 + 1) {
      local_81 = *local_78;
      bVar1 = isLogicDigit(local_81);
      if (bVar1) {
        local_82 = (uint8_t)getLogicCharValue('\0');
        addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      }
      else {
        bVar1 = isBinaryDigit(local_81);
        DVar6 = SUB84((ulong)pSVar3 >> 0x20,0);
        if (bVar1) {
          uVar2 = getDigitValue(local_81);
          logic_t::logic_t(&local_83,uVar2);
          addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        }
        else if (local_81 != '_') {
          local_88 = 2;
          local_90 = SourceLocation::operator+<int>
                               ((SourceLocation *)location_00,
                                (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          addDiag(in_stack_fffffffffffffeb0,DVar6,location_00);
          return -1;
        }
      }
      local_64 = local_64 + 1;
    }
    break;
  case (SourceLocation)0x1:
    local_98 = &local_48;
    local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_98);
    local_a8 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_98);
    for (; local_a0 != local_a8; local_a0 = local_a0 + 1) {
      local_a9 = *local_a0;
      bVar1 = isLogicDigit(local_a9);
      if (bVar1) {
        local_aa = (uint8_t)getLogicCharValue('\0');
        addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      }
      else {
        bVar1 = isOctalDigit(local_a9);
        DVar6 = SUB84((ulong)pSVar3 >> 0x20,0);
        if (bVar1) {
          uVar2 = getDigitValue(local_a9);
          logic_t::logic_t(&local_ab,uVar2);
          addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        }
        else if (local_a9 != '_') {
          local_b0 = 0x30002;
          local_b8 = SourceLocation::operator+<int>
                               ((SourceLocation *)location_00,
                                (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          addDiag(in_stack_fffffffffffffeb0,DVar6,location_00);
          return -1;
        }
      }
      local_64 = local_64 + 1;
    }
    break;
  case (SourceLocation)0x2:
    if ((local_21 & 1) != 0) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48);
      if (sVar4 == 1) {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_48,0);
        bVar1 = isLogicDigit(*pvVar5);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_48,0);
          digit.value = (uint8_t)((ulong)pSVar3 >> 0x38);
          maxValue = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
          local_b9 = (uint8_t)getLogicCharValue('\0');
          addDigit((NumberParser *)location_00,digit,maxValue);
          break;
        }
      }
      if (local_18.kind == IntegerLiteral) {
        Token::intValue((Token *)location_00);
        SVInt::operator=((SVInt *)location_00,(SVInt *)in_stack_fffffffffffffeb0);
        SVInt::~SVInt((SVInt *)pSVar3);
        break;
      }
    }
    local_d8 = &local_48;
    local_e0 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_d8);
    local_e8 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_d8);
    for (; local_e0 != local_e8; local_e0 = local_e0 + 1) {
      local_e9 = *local_e0;
      bVar1 = isLogicDigit(local_e9);
      if (bVar1) {
LAB_0041c1cc:
        DVar6 = SUB84((ulong)pSVar3 >> 0x20,0);
        if ((*(byte *)(in_RDI + 0x19) & 1) != 0) {
          local_ee = 0x40002;
          local_f8 = SourceLocation::operator+<int>
                               ((SourceLocation *)location_00,
                                (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          addDiag(in_stack_fffffffffffffeb0,DVar6,location_00);
          return -1;
        }
        bVar1 = isLogicDigit(local_e9);
        *(bool *)(in_RDI + 0x19) = bVar1;
      }
      else {
        bVar1 = isDecimalDigit(local_e9);
        DVar6 = SUB84((ulong)pSVar3 >> 0x20,0);
        if (bVar1) goto LAB_0041c1cc;
        if (local_e9 != '_') {
          local_fc = 0x10002;
          local_108 = SourceLocation::operator+<int>
                                ((SourceLocation *)location_00,
                                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          addDiag(in_stack_fffffffffffffeb0,DVar6,location_00);
          return -1;
        }
      }
      local_64 = local_64 + 1;
    }
    break;
  case (SourceLocation)0x3:
    local_110 = &local_48;
    local_118 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_110);
    local_120 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_110);
    for (; local_118 != local_120; local_118 = local_118 + 1) {
      local_121 = *local_118;
      bVar1 = isLogicDigit(local_121);
      if (bVar1) {
        local_122 = (uint8_t)getLogicCharValue('\0');
        addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      }
      else {
        bVar1 = isHexDigit(local_121);
        DVar6 = SUB84((ulong)pSVar3 >> 0x20,0);
        if (bVar1) {
          uVar2 = getHexDigitValue(local_121);
          logic_t::logic_t(&local_123,uVar2);
          addDigit((NumberParser *)location_00,(logic_t)(uint8_t)((ulong)pSVar3 >> 0x38),
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        }
        else {
          if ((local_121 == '+') || (local_121 == '-')) {
            pSVar3 = (SmallVectorBase<char> *)(in_RDI + 0x80);
            sVar4 = SmallVectorBase<char>::size((SmallVectorBase<char> *)(in_RDI + 0x80));
            std::basic_string_view<char,_std::char_traits<char>_>::size(&local_48);
            SmallVectorBase<char>::resize(pSVar3,sVar4);
            *(undefined1 *)(in_RDI + 0x1a) = 1;
            return local_64;
          }
          if (local_121 != '_') {
            SourceLocation::operator+<int>
                      ((SourceLocation *)location_00,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20)
                      );
            addDiag(in_stack_fffffffffffffeb0,DVar6,location_00);
            return -1;
          }
        }
      }
      local_64 = local_64 + 1;
    }
  }
  *(undefined1 *)(in_RDI + 0x1a) = 1;
  return -1;
}

Assistant:

int NumberParser::append(Token token, bool isFirst) {
    text.append_range(token.rawText());

    // If we've had an error thus far, don't bother doing anything else that
    // might just add more errors on the pile.
    if (!valid)
        return -1;

    // set valid to false since we return early when we encounter errors
    // if we're still good at the end of the function we'll flip this back
    valid = false;

    // underscore as the first char is not allowed
    std::string_view chars = token.rawText();
    SourceLocation location = token.location();
    if (isFirst && chars.length() && chars[0] == '_') {
        addDiag(diag::DigitsLeadingUnderscore, location);
        return -1;
    }

    int index = 0;
    switch (literalBase) {
        case LiteralBase::Binary:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 2);
                else if (isBinaryDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 2);
                else if (c != '_') {
                    addDiag(diag::BadBinaryDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Octal:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 8);
                else if (isOctalDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 8);
                else if (c != '_') {
                    addDiag(diag::BadOctalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Decimal:
            // Decimals have the restriction that you can only use x or z if it's the only digit.
            // Further, they can obviously only have decimal numbers (not A-F letters). Combined,
            // this means that we should only ever see one token here in practice, unless there's
            // an error. Optimize for this case and just suck the decimal value that's already
            // been computed out of the token itself.
            if (isFirst) {
                if (chars.length() == 1 && isLogicDigit(chars[0])) {
                    addDigit(getLogicCharValue(chars[0]), 10);
                    break;
                }

                if (token.kind == TokenKind::IntegerLiteral) {
                    decimalValue = token.intValue();
                    break;
                }
            }

            // As mentioned above, this loop is just for checking errors.
            for (char c : chars) {
                if (isLogicDigit(c) || isDecimalDigit(c)) {
                    if (hasUnknown) {
                        addDiag(diag::DecimalDigitMultipleUnknown, location + index);
                        return -1;
                    }

                    hasUnknown = isLogicDigit(c);
                }
                else if (c != '_') {
                    addDiag(diag::BadDecimalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Hex:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 16);
                else if (isHexDigit(c))
                    addDigit(logic_t(getHexDigitValue(c)), 16);
                else if (c == '+' || c == '-') {
                    // This is ok, this was initially lexed as a real token with exponent.
                    // Slice off everything after and including the operator, which will
                    // become new tokens.
                    text.resize(text.size() - (chars.size() - size_t(index)));
                    valid = true;
                    return index;
                }
                else if (c != '_') {
                    addDiag(diag::BadHexDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
    }

    valid = true;
    return -1;
}